

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExpressionTimingCheckArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionTimingCheckArgSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::TimingCheckConditionSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,TimingCheckConditionSyntax **args_1)

{
  ExpressionTimingCheckArgSyntax *this_00;
  TimingCheckConditionSyntax **args_local_1;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ExpressionTimingCheckArgSyntax *)allocate(this,0x20,8);
  slang::syntax::ExpressionTimingCheckArgSyntax::ExpressionTimingCheckArgSyntax
            (this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }